

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O2

void __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::render_section(basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                 *this,render_handler *handler,
                context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                *ctx,component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                     *incomp,
                basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                *var)

{
  vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  *pvVar1;
  pointer pbVar2;
  const_iterator __end0;
  const_iterator __begin0;
  pointer pbVar3;
  context_pusher<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ctxpusher;
  anon_class_24_3_6f1512f8 callback;
  context_pusher<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_70;
  walk_callback local_68;
  anon_class_24_3_6f1512f8 local_48;
  
  local_48.handler = handler;
  local_48.ctx = ctx;
  local_48.this = this;
  if (var == (basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              *)0x0) {
    (ctx->line_buffer).contained_section_tag = true;
    std::
    function<kainjow::mustache::component<std::__cxx11::wstring>::walk_control(kainjow::mustache::component<std::__cxx11::wstring>&)>
    ::
    function<kainjow::mustache::basic_mustache<std::__cxx11::wstring>::render_section(std::function<void(std::__cxx11::wstring_const&)>const&,kainjow::mustache::context_internal<std::__cxx11::wstring>&,kainjow::mustache::component<std::__cxx11::wstring>&,kainjow::mustache::basic_data<std::__cxx11::wstring>const*)::_lambda(kainjow::mustache::component<std::__cxx11::wstring>&)_1_const&,void>
              ((function<kainjow::mustache::component<std::__cxx11::wstring>::walk_control(kainjow::mustache::component<std::__cxx11::wstring>&)>
                *)&local_68,&local_48);
    component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::walk_children(incomp,&local_68);
    Catch::clara::std::_Function_base::~_Function_base(&local_68.super__Function_base);
    (ctx->line_buffer).contained_section_tag = true;
  }
  else {
    if (var->type_ == list) {
      pvVar1 = (var->list_)._M_t.
               super___uniq_ptr_impl<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>,_std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_*,_std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>_>
               .
               super__Head_base<0UL,_std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_*,_false>
               ._M_head_impl;
      pbVar3 = *(pointer *)
                &(pvVar1->
                 super__Vector_base<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                 )._M_impl;
      pbVar2 = (pvVar1->
               super__Vector_base<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar3 != pbVar2) {
        for (; pbVar3 != pbVar2; pbVar3 = pbVar3 + 1) {
          (ctx->line_buffer).contained_section_tag = true;
          local_70.ctx_ = ctx;
          (*ctx->ctx->_vptr_basic_context[2])(ctx->ctx,pbVar3);
          std::
          function<kainjow::mustache::component<std::__cxx11::wstring>::walk_control(kainjow::mustache::component<std::__cxx11::wstring>&)>
          ::
          function<kainjow::mustache::basic_mustache<std::__cxx11::wstring>::render_section(std::function<void(std::__cxx11::wstring_const&)>const&,kainjow::mustache::context_internal<std::__cxx11::wstring>&,kainjow::mustache::component<std::__cxx11::wstring>&,kainjow::mustache::basic_data<std::__cxx11::wstring>const*)::_lambda(kainjow::mustache::component<std::__cxx11::wstring>&)_1_const&,void>
                    ((function<kainjow::mustache::component<std::__cxx11::wstring>::walk_control(kainjow::mustache::component<std::__cxx11::wstring>&)>
                      *)&local_68,&local_48);
          component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          ::walk_children(incomp,&local_68);
          Catch::clara::std::_Function_base::~_Function_base(&local_68.super__Function_base);
          (ctx->line_buffer).contained_section_tag = true;
          context_pusher<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          ::~context_pusher(&local_70);
        }
        return;
      }
    }
    (ctx->line_buffer).contained_section_tag = true;
    local_70.ctx_ = ctx;
    (*ctx->ctx->_vptr_basic_context[2])(ctx->ctx,var);
    std::
    function<kainjow::mustache::component<std::__cxx11::wstring>::walk_control(kainjow::mustache::component<std::__cxx11::wstring>&)>
    ::
    function<kainjow::mustache::basic_mustache<std::__cxx11::wstring>::render_section(std::function<void(std::__cxx11::wstring_const&)>const&,kainjow::mustache::context_internal<std::__cxx11::wstring>&,kainjow::mustache::component<std::__cxx11::wstring>&,kainjow::mustache::basic_data<std::__cxx11::wstring>const*)::_lambda(kainjow::mustache::component<std::__cxx11::wstring>&)_1_const&,void>
              ((function<kainjow::mustache::component<std::__cxx11::wstring>::walk_control(kainjow::mustache::component<std::__cxx11::wstring>&)>
                *)&local_68,&local_48);
    component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::walk_children(incomp,&local_68);
    Catch::clara::std::_Function_base::~_Function_base(&local_68.super__Function_base);
    (ctx->line_buffer).contained_section_tag = true;
    context_pusher<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::~context_pusher(&local_70);
  }
  return;
}

Assistant:

void render_section(const render_handler& handler, context_internal<string_type>& ctx, component<string_type>& incomp, const basic_data<string_type>* var) {
        const auto callback = [&handler, &ctx, this](component<string_type>& comp) -> typename component<string_type>::walk_control {
            return render_component(handler, ctx, comp);
        };
        if (var && var->is_non_empty_list()) {
            for (const auto& item : var->list_value()) {
                // account for the section begin tag
                ctx.line_buffer.contained_section_tag = true;

                const context_pusher<string_type> ctxpusher{ctx, &item};
                incomp.walk_children(callback);

                // ctx may have been cleared. account for the section end tag
                ctx.line_buffer.contained_section_tag = true;
            }
        } else if (var) {
            // account for the section begin tag
            ctx.line_buffer.contained_section_tag = true;

            const context_pusher<string_type> ctxpusher{ctx, var};
            incomp.walk_children(callback);

            // ctx may have been cleared. account for the section end tag
            ctx.line_buffer.contained_section_tag = true;
        } else {
            // account for the section begin tag
            ctx.line_buffer.contained_section_tag = true;

            incomp.walk_children(callback);

            // ctx may have been cleared. account for the section end tag
            ctx.line_buffer.contained_section_tag = true;
        }
    }